

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O0

QList<QGraphicsItem_*> * __thiscall
QGraphicsSceneBspTree::items(QGraphicsSceneBspTree *this,QRectF *rect,bool onlyTopLevelItems)

{
  byte bVar1;
  bool bVar2;
  const_iterator o;
  QGraphicsItem **ppQVar3;
  QGraphicsItemPrivate *pQVar4;
  byte in_CL;
  anon_class_16_2_a6e56972 *in_RDX;
  QGraphicsSceneBspTree *in_RSI;
  QList<QGraphicsItem_*> *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem **foundItem;
  add_const_t<QList<QGraphicsItem_*>_> *__range1;
  QList<QGraphicsItem_*> *foundItems;
  const_iterator __end1;
  const_iterator __begin1;
  undefined8 in_stack_ffffffffffffffa8;
  int index;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 uVar5;
  QGraphicsSceneBspTree *this_00;
  const_iterator local_20 [2];
  byte local_10;
  long local_8;
  
  index = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_CL & 1;
  uVar5 = 0;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RSI;
  QList<QGraphicsItem_*>::QList((QList<QGraphicsItem_*> *)0xa1888d);
  local_10 = bVar1 & 1;
  climbTree<QGraphicsSceneBspTree::items(QRectF_const&,bool)const::__0>
            (this_00,in_RDX,(QRectF *)CONCAT17(bVar1,CONCAT16(uVar5,in_stack_ffffffffffffffb0)),
             index);
  local_20[0].i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_20[0] = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)in_RSI);
  o = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)in_RSI);
  while (bVar2 = QList<QGraphicsItem_*>::const_iterator::operator!=(local_20,o), bVar2) {
    ppQVar3 = QList<QGraphicsItem_*>::const_iterator::operator*(local_20);
    pQVar4 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&(*ppQVar3)->d_ptr);
    *(ulong *)&pQVar4->field_0x160 = *(ulong *)&pQVar4->field_0x160 & 0xffffffffffffbfff;
    QList<QGraphicsItem_*>::const_iterator::operator++(local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QList<QGraphicsItem *> QGraphicsSceneBspTree::items(const QRectF &rect, bool onlyTopLevelItems) const
{
    QList<QGraphicsItem *> foundItems;
    climbTree([&foundItems, onlyTopLevelItems](QList<QGraphicsItem *> *items) {
        for (int i = 0; i < items->size(); ++i) {
            QGraphicsItem *item = items->at(i);
            if (onlyTopLevelItems && item->d_ptr->parent)
                item = item->topLevelItem();
            if (!item->d_func()->itemDiscovered && item->d_ptr->visible) {
                item->d_func()->itemDiscovered = 1;
                foundItems.prepend(item);
            }
        }
    }, rect);
    // Reset discovery bits.
    for (const auto &foundItem : std::as_const(foundItems))
        foundItem->d_ptr->itemDiscovered = 0;
    return foundItems;
}